

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.c
# Opt level: O2

int add_f5_gquad(vrna_fold_compound_t *fc,int j,vrna_callback_hc_evaluate *evaluate,
                default_data *hc_dat_local,sc_wrapper_f5 *sc_wrapper)

{
  int *piVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  int *piVar5;
  int iVar6;
  
  piVar1 = (fc->matrices->field_2).field_0.ggg;
  uVar2 = j + ~(fc->params->model_details).min_loop_size;
  piVar5 = piVar1 + (int)(uVar2 + fc->jindx[j]);
  iVar4 = 10000000;
  for (uVar3 = (ulong)uVar2; 1 < (int)uVar3; uVar3 = uVar3 - 1) {
    iVar6 = (fc->matrices->field_2).field_0.f5[uVar3 - 1];
    if ((iVar6 != 10000000) && (*piVar5 != 10000000)) {
      iVar6 = *piVar5 + iVar6;
      if (iVar6 <= iVar4) {
        iVar4 = iVar6;
      }
    }
    piVar5 = piVar5 + -1;
  }
  iVar6 = piVar1[(long)fc->jindx[j] + 1];
  if (iVar4 < iVar6) {
    iVar6 = iVar4;
  }
  return iVar6;
}

Assistant:

int
add_f5_gquad(vrna_fold_compound_t       *fc,
             int                        j,
             vrna_callback_hc_evaluate  *evaluate,
             struct default_data        *hc_dat_local,
             struct sc_wrapper_f5       *sc_wrapper)
{
  int e, i, ij, *indx, turn, *f5, *ggg;

  indx  = fc->jindx;
  f5    = fc->matrices->f5;
  ggg   = fc->matrices->ggg;
  turn  = fc->params->model_details.min_loop_size;
  ij    = indx[j] + j - turn - 1;
  e     = INF;

  for (i = j - turn - 1; i > 1; i--, ij--)
    if ((f5[i - 1] != INF) && (ggg[ij] != INF))
      e = MIN2(e, f5[i - 1] + ggg[ij]);

  ij  = indx[j] + 1;
  e   = MIN2(e, ggg[ij]);

  return e;
}